

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::RepeatedMessageFieldGenerator::PrintNestedBuilderCondition
          (RepeatedMessageFieldGenerator *this,Printer *printer,char *regular_case,
          char *nested_builder_case)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  
  variables = &this->variables_;
  if (*(int *)(*(long *)(*(long *)(*(long *)(this->descriptor_ + 0x38) + 0x10) + 0x88) + 0x50) == 3)
  {
    io::Printer::Print(printer,variables,regular_case);
    return;
  }
  io::Printer::Print(printer,variables,"if ($name$Builder_ == null) {\n");
  io::Printer::Indent(printer);
  io::Printer::Print(printer,variables,regular_case);
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"} else {\n");
  io::Printer::Indent(printer);
  io::Printer::Print(printer,variables,nested_builder_case);
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void RepeatedMessageFieldGenerator::PrintNestedBuilderCondition(
    io::Printer* printer,
    const char* regular_case,
    const char* nested_builder_case) const {
  if (HasNestedBuilders(descriptor_->containing_type())) {
     printer->Print(variables_, "if ($name$Builder_ == null) {\n");
     printer->Indent();
     printer->Print(variables_, regular_case);
     printer->Outdent();
     printer->Print("} else {\n");
     printer->Indent();
     printer->Print(variables_, nested_builder_case);
     printer->Outdent();
     printer->Print("}\n");
   } else {
     printer->Print(variables_, regular_case);
   }
}